

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_superres_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  RK_U8 local_40 [4];
  RK_U8 local_3c [4];
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  RK_S32 denom;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _err = ctx->sequence_header;
  seq = (AV1RawSequenceHeader *)current;
  current_local = (AV1RawFrameHeader *)gb;
  gb_local = &ctx->gb;
  if (_err->enable_superres == '\0') {
    current->use_superres = '\0';
  }
  else {
    value_1 = mpp_av1_read_unsigned(gb,1,"use_superres",(RK_U32 *)local_3c,0,1);
    if ((int)value_1 < 0) {
      return value_1;
    }
    seq->seq_tier[0x1e] = local_3c[0];
  }
  if (seq->seq_tier[0x1e] == '\0') {
    value = 8;
  }
  else {
    RVar1 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)current_local,3,"coded_denom",(RK_U32 *)local_40,0,7);
    if (RVar1 < 0) {
      return RVar1;
    }
    seq->seq_tier[0x1f] = local_40[0];
    value = seq->seq_tier[0x1f] + 9;
  }
  *(undefined4 *)((long)&gb_local[0x50].emulation_prevention_bytes_ + 4) =
       *(undefined4 *)((long)&gb_local[0x50].prev_two_bytes_ + 4);
  *(int *)((long)&gb_local[0x50].prev_two_bytes_ + 4) =
       (int)(*(int *)((long)&gb_local[0x50].emulation_prevention_bytes_ + 4) * 8 + value / 2) /
       (int)value;
  return 0;
}

Assistant:

static RK_S32 mpp_av1_superres_params(AV1Context *ctx, BitReadCtx_t *gb,
                                      AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 denom, err;

    if (seq->enable_superres)
        flag(use_superres);
    else
        infer(use_superres, 0);

    if (current->use_superres) {
        fb(3, coded_denom);
        denom = current->coded_denom + AV1_SUPERRES_DENOM_MIN;
    } else {
        denom = AV1_SUPERRES_NUM;
    }

    ctx->upscaled_width = ctx->frame_width;
    ctx->frame_width = (ctx->upscaled_width * AV1_SUPERRES_NUM +
                        denom / 2) / denom;
    return 0;
}